

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

int IPdr_ManRebuildClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses)

{
  Vec_Vec_t *pVVar1;
  void *pvVar2;
  int iVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  uint uVar6;
  Pdr_Man_t *pCube;
  Pdr_Man_t *pPVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    iVar3 = -1;
  }
  else {
    if (vClauses->nSize < 2) {
      __assert_fail("Vec_VecSize(vClauses) >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x10b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    pVVar1 = p->vClauses;
    if (pVVar1->nSize != 0) {
      __assert_fail("Vec_VecSize(p->vClauses) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x10c,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
    }
    if (pVVar1->nCap < 2) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x10);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar1->pArray,0x10);
      }
      pVVar1->pArray = ppvVar4;
      pVVar1->nCap = 2;
    }
    lVar8 = (long)pVVar1->nSize;
    if (lVar8 < 2) {
      do {
        lVar9 = lVar8 + 1;
        puVar5 = (undefined8 *)malloc(0x10);
        *puVar5 = 0;
        puVar5[1] = 0;
        pVVar1->pArray[lVar8] = puVar5;
        lVar8 = lVar9;
      } while ((int)lVar9 != 2);
    }
    pVVar1->nSize = 2;
    uVar6 = 0;
    pCube = p;
    IPdr_ManSetSolver(p,0,1);
    iVar3 = (int)pCube;
    if (1 < vClauses->nSize) {
      uVar10 = 1;
      uVar6 = 0;
      do {
        pvVar2 = vClauses->pArray[uVar10];
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar8 = 0;
          do {
            pCube = *(Pdr_Man_t **)(*(long *)((long)pvVar2 + 8) + lVar8 * 8);
            pPVar7 = p;
            iVar3 = Pdr_ManCheckCube(p,0,(Pdr_Set_t *)pCube,(Pdr_Set_t **)0x0,0,0,1);
            if (p->vActVars->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *p->vActVars->pArray = 0;
            if (iVar3 == 0) {
              Abc_Print((int)pPVar7,"Cube[%d][%d] cannot be pushed from R0 to R1.\n",
                        uVar10 & 0xffffffff);
              Pdr_SetDeref((Pdr_Set_t *)pCube);
            }
            else {
              if (iVar3 == -1) {
                __assert_fail("RetValue != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                              ,0x11b,"int IPdr_ManRebuildClauses(Pdr_Man_t *, Vec_Vec_t *)");
              }
              pPVar7 = (Pdr_Man_t *)p->vClauses;
              Vec_VecPush((Vec_Vec_t *)pPVar7,1,pCube);
              pCube = pPVar7;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar2 + 4));
          uVar6 = uVar6 + (int)lVar8;
        }
        iVar3 = (int)pCube;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)vClauses->nSize);
    }
    if (p->vClauses->nSize < 2) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
    }
    Abc_Print(iVar3,"RebuildClauses: %d out of %d cubes reused in R1.\n",
              (ulong)*(uint *)((long)p->vClauses->pArray[1] + 4),(ulong)uVar6);
    IPdr_ManSetSolver(p,1,0);
    if (0 < vClauses->nSize) {
      lVar8 = 0;
      do {
        pvVar2 = vClauses->pArray[lVar8];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vClauses->nSize);
    }
    if (vClauses->pArray != (void **)0x0) {
      free(vClauses->pArray);
      vClauses->pArray = (void **)0x0;
    }
    free(vClauses);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int IPdr_ManRebuildClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;
    int RetValue = -1;
    int nCubes = 0;

    if ( vClauses == NULL )
        return RetValue;

    assert( Vec_VecSize(vClauses) >= 2 );
    assert( Vec_VecSize(p->vClauses) == 0 ); 
    Vec_VecExpand( p->vClauses, 1 );

    IPdr_ManSetSolver( p, 0, 1 );

    // push clauses from R0 to R1
    Vec_VecForEachLevelStart( vClauses, vArrayK, i, 1 )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
        {
            ++nCubes;

            RetValue = Pdr_ManCheckCube( p, 0, pCube, NULL, 0, 0, 1 );
            Vec_IntWriteEntry( p->vActVars, 0, 0 );

            assert( RetValue != -1 );

            if ( RetValue == 0 )
            {
                Abc_Print( 1, "Cube[%d][%d] cannot be pushed from R0 to R1.\n", i, j );
                Pdr_SetDeref( pCube );
                continue;
            }

            Vec_VecPush( p->vClauses, 1, pCube );
        }
    }
    Abc_Print( 1, "RebuildClauses: %d out of %d cubes reused in R1.\n", Vec_PtrSize(Vec_VecEntry(p->vClauses, 1)), nCubes );
    IPdr_ManSetSolver( p, 1, 0 );
    Vec_VecFree( vClauses );

    /*
    for ( i = 1; i < Vec_VecSize( vClauses ) - 1; ++i )
    {
        vArrayK = IPdr_ManPushClausesK( p, i );
        if ( Vec_PtrSize(vArrayK) == 0 )
        {
            Abc_Print( 1, "RebuildClauses: stopped at frame %d.\n", i );
            break;
        }

        Vec_PtrGrow( (Vec_Ptr_t *)(p->vClauses), i + 2 );
        p->vClauses->nSize = i + 2;
        p->vClauses->pArray[i+1] = vArrayK;
        IPdr_ManSetSolver( p, i + 1, 0 );
    }

    Abc_Print( 1, "After rebuild:" );
    Vec_VecForEachLevel( p->vClauses, vArrayK, i )
        Abc_Print( 1, " %d", Vec_PtrSize( vArrayK ) );
    Abc_Print( 1, "\n" );
    */

    return 0;
}